

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

ssize_t __thiscall Bstrlib::CBStream::read(CBStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  CBStringException *this_00;
  undefined4 in_register_00000034;
  bstring local_88;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  CBString *s_local;
  CBStream *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  *(undefined4 *)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 0xc) = 0;
  do {
    iVar1 = bseof(this->m_s);
    uVar2 = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),iVar1 != 0) ^ 0xff;
    if ((uVar2 & 1) == 0) {
      return uVar2;
    }
    local_88 = (bstring)0x0;
    if (bstr__cppwrapper_exception.msg.field_2._8_8_ != 0) {
      local_88 = (bstring)(bstr__cppwrapper_exception.msg.field_2._8_8_ + 8);
    }
    iVar1 = bsreada(local_88,this->m_s,0x400);
  } while (-1 < iVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CBString::Failed read",&local_61);
  CBStringException::CBStringException((CBStringException *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,(CBStringException *)local_40);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBStream::read (CBString& s) {
	s.slen = 0;
	while (!bseof (m_s)) {
		if (0 > bsreada ((bstring) &s, m_s, BS_BUFF_SZ)) {
			bstringThrow ("Failed read");
		}
	}
}